

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::put_bits(jpeg_encoder *this,uint bits,uint len)

{
  uint8 *puVar1;
  uint8 uVar2;
  uint uVar3;
  uint8 c;
  uint len_local;
  uint bits_local;
  jpeg_encoder *this_local;
  
  uVar3 = len + this->m_bits_in;
  this->m_bits_in = uVar3;
  this->m_bit_buffer = bits << (0x18U - (char)uVar3 & 0x1f) | this->m_bit_buffer;
  while (7 < this->m_bits_in) {
    uVar2 = (uint8)(this->m_bit_buffer >> 0x10);
    puVar1 = this->m_pOut_buf;
    this->m_pOut_buf = puVar1 + 1;
    *puVar1 = uVar2;
    uVar3 = this->m_out_buf_left - 1;
    this->m_out_buf_left = uVar3;
    if (uVar3 == 0) {
      flush_output_buffer(this);
    }
    if (uVar2 == 0xff) {
      puVar1 = this->m_pOut_buf;
      this->m_pOut_buf = puVar1 + 1;
      *puVar1 = '\0';
      uVar3 = this->m_out_buf_left - 1;
      this->m_out_buf_left = uVar3;
      if (uVar3 == 0) {
        flush_output_buffer(this);
      }
    }
    this->m_bit_buffer = this->m_bit_buffer << 8;
    this->m_bits_in = this->m_bits_in - 8;
  }
  return;
}

Assistant:

void jpeg_encoder::put_bits(uint bits, uint len)
	{
		m_bit_buffer |= ((uint32)bits << (24 - (m_bits_in += len)));
		while (m_bits_in >= 8)
		{
			uint8 c;
#define JPGE_PUT_BYTE(c) { *m_pOut_buf++ = (c); if (--m_out_buf_left == 0) flush_output_buffer(); }
			JPGE_PUT_BYTE(c = (uint8)((m_bit_buffer >> 16) & 0xFF));
			if (c == 0xFF) JPGE_PUT_BYTE(0);
			m_bit_buffer <<= 8;
			m_bits_in -= 8;
		}
	}